

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_flatten_after_innerproduct(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  bool bVar4;
  size_type sVar5;
  reference ppLVar6;
  reference pvVar7;
  size_type sVar8;
  undefined8 uVar9;
  reference pvVar10;
  long in_RDI;
  int top_blob_index_final;
  Flatten *flatten;
  InnerProduct *innerproduct;
  int j;
  int top_blob_index;
  int i;
  size_t layer_count;
  FILE *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  int local_1c;
  int local_14;
  
  sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  local_14 = 0;
  do {
    if (sVar5 <= (ulong)(long)local_14) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_14);
    bVar4 = std::operator!=(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    if (!bVar4) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_14);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->tops,0);
      iVar1 = *pvVar7;
      local_1c = local_14;
      do {
        do {
          do {
            local_1c = local_1c + 1;
            if (sVar5 <= (ulong)(long)local_1c) goto LAB_00121652;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)local_1c);
            bVar4 = std::operator!=(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
          } while (bVar4);
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_1c);
          sVar8 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->bottoms);
        } while (sVar8 != 1);
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_1c);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->bottoms,0);
      } while (*pvVar7 != iVar1);
LAB_00121652:
      if ((long)local_1c != sVar5) {
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_14);
        pLVar2 = *ppLVar6;
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_1c);
        pLVar3 = *ppLVar6;
        in_stack_ffffffffffffffa8 = _stderr;
        in_stack_ffffffffffffffb0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::c_str();
        uVar9 = std::__cxx11::string::c_str();
        fprintf(in_stack_ffffffffffffffa8,"eliminate_flatten_after_innerproduct %s %s\n",
                in_stack_ffffffffffffffb0,uVar9);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
        iVar1 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
        *pvVar7 = iVar1;
        pvVar10 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                             (long)iVar1);
        pvVar10->producer = local_14;
        std::__cxx11::string::operator=((string *)&pLVar3->type,"ncnnfused");
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_flatten_after_innerproduct()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Flatten
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Flatten")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Flatten* flatten = (ncnn::Flatten*)layers[j];

        fprintf(stderr, "eliminate_flatten_after_innerproduct %s %s\n", innerproduct->name.c_str(), flatten->name.c_str());

        int top_blob_index_final = flatten->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        flatten->type = "ncnnfused";
    }

    return 0;
}